

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O0

void __thiscall
vkt::DefaultDevice::DefaultDevice
          (DefaultDevice *this,PlatformInterface *vkPlatform,CommandLine *cmdLine)

{
  RefData<vk::VkInstance_s_*> data;
  RefData<vk::VkDevice_s_*> data_00;
  CommandLine *platformInterface;
  deUint32 dVar1;
  VkInstance_s **ppVVar2;
  VkPhysicalDevice pVVar3;
  VkDevice_s **ppVVar4;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *deviceExtensions;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *deviceExtensions_00
  ;
  Move<vk::VkDevice_s_*> local_1a0;
  RefData<vk::VkDevice_s_*> local_188;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_170;
  VkPhysicalDeviceFeatures local_154;
  Move<vk::VkInstance_s_*> local_78;
  RefData<vk::VkInstance_s_*> local_60;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_38;
  CommandLine *local_20;
  CommandLine *cmdLine_local;
  PlatformInterface *vkPlatform_local;
  DefaultDevice *this_local;
  
  local_20 = cmdLine;
  cmdLine_local = (CommandLine *)vkPlatform;
  vkPlatform_local = (PlatformInterface *)this;
  ::vk::enumerateInstanceExtensionProperties(&local_38,vkPlatform,(char *)0x0);
  filterExtensions_abi_cxx11_(&this->m_instanceExtensions,(vkt *)&local_38,deviceExtensions);
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            (&local_38);
  vkt::createInstance(&local_78,(PlatformInterface *)cmdLine_local,&this->m_instanceExtensions,
                      local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_78);
  data.deleter.m_destroyInstance = local_60.deleter.m_destroyInstance;
  data.object = local_60.object;
  data.deleter.m_allocator = local_60.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique(&this->m_instance,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_78);
  platformInterface = cmdLine_local;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      (&(this->m_instance).super_RefBase<vk::VkInstance_s_*>);
  ::vk::InstanceDriver::InstanceDriver
            (&this->m_instanceInterface,(PlatformInterface *)platformInterface,*ppVVar2);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      (&(this->m_instance).super_RefBase<vk::VkInstance_s_*>);
  pVVar3 = ::vk::chooseDevice(&(this->m_instanceInterface).super_InstanceInterface,*ppVVar2,local_20
                             );
  this->m_physicalDevice = pVVar3;
  dVar1 = findQueueFamilyIndexWithCaps
                    (&(this->m_instanceInterface).super_InstanceInterface,this->m_physicalDevice,3);
  this->m_universalQueueFamilyIndex = dVar1;
  ::vk::getPhysicalDeviceFeatures
            (&local_154,&(this->m_instanceInterface).super_InstanceInterface,this->m_physicalDevice)
  ;
  filterDefaultDeviceFeatures(&this->m_deviceFeatures,&local_154);
  ::vk::getPhysicalDeviceProperties
            (&this->m_deviceProperties,&(this->m_instanceInterface).super_InstanceInterface,
             this->m_physicalDevice);
  ::vk::enumerateDeviceExtensionProperties
            (&local_170,&(this->m_instanceInterface).super_InstanceInterface,this->m_physicalDevice,
             (char *)0x0);
  filterExtensions_abi_cxx11_(&this->m_deviceExtensions,(vkt *)&local_170,deviceExtensions_00);
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            (&local_170);
  createDefaultDevice(&local_1a0,&(this->m_instanceInterface).super_InstanceInterface,
                      this->m_physicalDevice,this->m_universalQueueFamilyIndex,
                      &this->m_deviceFeatures,&this->m_deviceExtensions,local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a0);
  data_00.deleter.m_destroyDevice = local_188.deleter.m_destroyDevice;
  data_00.object = local_188.object;
  data_00.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique(&this->m_device,data_00);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_1a0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->m_device).super_RefBase<vk::VkDevice_s_*>);
  ::vk::DeviceDriver::DeviceDriver
            (&this->m_deviceInterface,&(this->m_instanceInterface).super_InstanceInterface,*ppVVar4)
  ;
  return;
}

Assistant:

DefaultDevice::DefaultDevice (const PlatformInterface& vkPlatform, const tcu::CommandLine& cmdLine)
	: m_instanceExtensions			(filterExtensions(enumerateInstanceExtensionProperties(vkPlatform, DE_NULL)))
	, m_instance					(createInstance(vkPlatform, m_instanceExtensions, cmdLine))
	, m_instanceInterface			(vkPlatform, *m_instance)
	, m_physicalDevice				(chooseDevice(m_instanceInterface, *m_instance, cmdLine))
	, m_universalQueueFamilyIndex	(findQueueFamilyIndexWithCaps(m_instanceInterface, m_physicalDevice, VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_COMPUTE_BIT))
	, m_deviceFeatures				(filterDefaultDeviceFeatures(getPhysicalDeviceFeatures(m_instanceInterface, m_physicalDevice)))
	, m_deviceProperties			(getPhysicalDeviceProperties(m_instanceInterface, m_physicalDevice))
	, m_deviceExtensions			(filterExtensions(enumerateDeviceExtensionProperties(m_instanceInterface, m_physicalDevice, DE_NULL)))
	, m_device						(createDefaultDevice(m_instanceInterface, m_physicalDevice, m_universalQueueFamilyIndex, m_deviceFeatures, m_deviceExtensions, cmdLine))
	, m_deviceInterface				(m_instanceInterface, *m_device)
{
}